

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deque.hpp
# Opt level: O0

void __thiscall
ft::deque<int,ft::allocator<int>>::assign<ft::constDequeIterator<int,64ul>>
          (deque<int,ft::allocator<int>> *this,constDequeIterator<int,_64UL> *first,
          constDequeIterator<int,_64UL> *last,type *param_3)

{
  bool bVar1;
  difference_type dVar2;
  const_reference pvVar3;
  type *in_R8;
  constDequeIterator<int,_64UL> local_178;
  constDequeIterator<int,_64UL> local_150;
  constDequeIterator<int,_64UL> local_128;
  constDequeIterator<int,_64UL> local_100;
  constDequeIterator<int,_64UL> local_d8;
  constDequeIterator<int,_64UL> local_a0;
  constDequeIterator<int,_64UL> local_78;
  undefined1 local_50 [8];
  constDequeIterator<int,_64UL> middle;
  type *param_3_local;
  constDequeIterator<int,_64UL> *last_local;
  constDequeIterator<int,_64UL> *first_local;
  deque<int,_ft::allocator<int>_> *this_local;
  
  middle.super_dequeIterator<int,_64UL>.m_node = (map_pointer)param_3;
  deque<int,_ft::allocator<int>_>::clear((deque<int,_ft::allocator<int>_> *)this);
  constDequeIterator<int,_64UL>::constDequeIterator(&local_78,first);
  constDequeIterator<int,_64UL>::constDequeIterator(&local_a0,first);
  constDequeIterator<int,_64UL>::constDequeIterator(&local_d8,last);
  dVar2 = distance<ft::constDequeIterator<int,64ul>>(&local_a0,&local_d8,(type *)0x0);
  next<ft::constDequeIterator<int,64ul>>
            ((constDequeIterator<int,_64UL> *)local_50,(ft *)&local_78,
             (constDequeIterator<int,_64UL> *)(dVar2 / 2),0,in_R8);
  constDequeIterator<int,_64UL>::~constDequeIterator(&local_d8);
  constDequeIterator<int,_64UL>::~constDequeIterator(&local_a0);
  constDequeIterator<int,_64UL>::~constDequeIterator(&local_78);
  while( true ) {
    bVar1 = operator!=((dequeIterator<int,_64UL> *)local_50,&last->super_dequeIterator<int,_64UL>);
    if (!bVar1) break;
    pvVar3 = constDequeIterator<int,_64UL>::operator*((constDequeIterator<int,_64UL> *)local_50);
    deque<int,_ft::allocator<int>_>::push_back((deque<int,_ft::allocator<int>_> *)this,pvVar3);
    dequeIterator<int,_64UL>::operator++((dequeIterator<int,_64UL> *)local_50);
  }
  constDequeIterator<int,_64UL>::constDequeIterator(&local_128,first);
  constDequeIterator<int,_64UL>::constDequeIterator(&local_150,first);
  constDequeIterator<int,_64UL>::constDequeIterator(&local_178,last);
  dVar2 = distance<ft::constDequeIterator<int,64ul>>(&local_150,&local_178,(type *)0x0);
  next<ft::constDequeIterator<int,64ul>>
            (&local_100,(ft *)&local_128,(constDequeIterator<int,_64UL> *)(dVar2 / 2),0,in_R8);
  constDequeIterator<int,_64UL>::operator=((constDequeIterator<int,_64UL> *)local_50,&local_100);
  constDequeIterator<int,_64UL>::~constDequeIterator(&local_100);
  constDequeIterator<int,_64UL>::~constDequeIterator(&local_178);
  constDequeIterator<int,_64UL>::~constDequeIterator(&local_150);
  constDequeIterator<int,_64UL>::~constDequeIterator(&local_128);
  while( true ) {
    bVar1 = operator!=((dequeIterator<int,_64UL> *)local_50,&first->super_dequeIterator<int,_64UL>);
    if (!bVar1) break;
    dequeIterator<int,_64UL>::operator--((dequeIterator<int,_64UL> *)local_50);
    pvVar3 = constDequeIterator<int,_64UL>::operator*((constDequeIterator<int,_64UL> *)local_50);
    deque<int,_ft::allocator<int>_>::push_front((deque<int,_ft::allocator<int>_> *)this,pvVar3);
  }
  constDequeIterator<int,_64UL>::~constDequeIterator((constDequeIterator<int,_64UL> *)local_50);
  return;
}

Assistant:

void assign(Iterator first, Iterator last,
				typename ft::_void_t<typename ft::iterator_traits<Iterator>::iterator_category>::type * = 0) {
		this->clear();

		Iterator	middle = ft::next(first, ft::distance(first, last) / 2);
		while (middle != last) {
			this->push_back(*middle);
			++middle;
		}

		middle = ft::next(first, ft::distance(first, last) / 2);
		while (middle != first) {
			--middle;
			this->push_front(*middle);
		}
	}